

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1908.c
# Opt level: O1

int test(char *URL)

{
  int iVar1;
  long lVar2;
  
  tv_test_start = tutil_tvnow();
  curl_global_init(3);
  lVar2 = curl_easy_init();
  if (lVar2 == 0) {
    iVar1 = 0;
  }
  else {
    curl_easy_setopt(lVar2,0x2712,URL);
    curl_easy_setopt(lVar2,0x2b,1);
    curl_easy_setopt(lVar2,0x282f,"log/altsvc-1908");
    iVar1 = curl_easy_perform(lVar2);
    curl_easy_reset(lVar2);
    curl_easy_cleanup(lVar2);
  }
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURLcode ret = CURLE_OK;
  CURL *hnd;
  start_test_timing();

  curl_global_init(CURL_GLOBAL_ALL);

  hnd = curl_easy_init();
  if(hnd) {
    curl_easy_setopt(hnd, CURLOPT_URL, URL);
    curl_easy_setopt(hnd, CURLOPT_NOPROGRESS, 1L);
    curl_easy_setopt(hnd, CURLOPT_ALTSVC, "log/altsvc-1908");
    ret = curl_easy_perform(hnd);
    curl_easy_reset(hnd);
    curl_easy_cleanup(hnd);
  }
  curl_global_cleanup();
  return (int)ret;
}